

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsKeyPressed(int user_key_index,bool repeat)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  bool local_25;
  float t;
  ImGuiContext *g;
  bool repeat_local;
  int user_key_index_local;
  
  if (user_key_index < 0) {
    repeat_local = false;
  }
  else {
    local_25 = 0x1ff < (uint)user_key_index;
    if (local_25) {
      __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown))))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x12c5,"bool ImGui::IsKeyPressed(int, bool)");
    }
    fVar2 = (GImGui->IO).KeysDownDuration[user_key_index];
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      if ((!repeat) || (pfVar1 = &(GImGui->IO).KeyRepeatDelay, fVar2 < *pfVar1 || fVar2 == *pfVar1))
      {
        repeat_local = false;
      }
      else {
        iVar3 = GetKeyPressedAmount(user_key_index,(GImGui->IO).KeyRepeatDelay,
                                    (GImGui->IO).KeyRepeatRate);
        repeat_local = 0 < iVar3;
      }
    }
    else {
      repeat_local = true;
    }
  }
  return repeat_local;
}

Assistant:

bool ImGui::IsKeyPressed(int user_key_index, bool repeat)
{
    ImGuiContext& g = *GImGui;
    if (user_key_index < 0)
        return false;
    IM_ASSERT(user_key_index >= 0 && user_key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    const float t = g.IO.KeysDownDuration[user_key_index];
    if (t == 0.0f)
        return true;
    if (repeat && t > g.IO.KeyRepeatDelay)
        return GetKeyPressedAmount(user_key_index, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0;
    return false;
}